

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void nn_free_options(nn_commandline *cline,void *target)

{
  nn_option_type nVar1;
  nn_option *pnVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pnVar2 = cline->options;
  if (pnVar2->longname != (char *)0x0) {
    lVar5 = 0;
    do {
      nVar1 = pnVar2->type;
      if (nVar1 - NN_OPT_LIST_APPEND < 2) {
        if (target == (void *)0x0) {
          nn_free_options_cold_1();
        }
        lVar3 = (long)pnVar2->offset;
        if (*(void **)((long)target + lVar3) != (void *)0x0) {
          free(*(void **)((long)target + lVar3));
          *(undefined8 *)((long)target + lVar3) = 0;
        }
        __ptr = *(void **)((long)target + lVar3 + 8);
        if (__ptr != (void *)0x0) {
          if (0 < *(int *)((long)target + lVar3 + 0x14)) {
            lVar4 = 0;
            do {
              free(*(void **)(*(long *)((long)target + lVar3 + 8) + lVar4 * 8));
              lVar4 = lVar4 + 1;
            } while (lVar4 < *(int *)((long)target + lVar3 + 0x14));
            __ptr = *(void **)((long)target + lVar3 + 8);
          }
          free(__ptr);
          *(undefined8 *)((long)target + lVar3 + 8) = 0;
        }
      }
      else if ((((nVar1 == NN_OPT_BLOB) || (nVar1 == NN_OPT_READ_FILE)) &&
               (lVar3 = (long)pnVar2->offset, *(int *)((long)target + lVar3 + 0x10) != 0)) &&
              (*(void **)((long)target + lVar3) != (void *)0x0)) {
        free(*(void **)((long)target + lVar3));
        *(undefined4 *)((long)target + lVar3 + 0x10) = 0;
      }
      lVar5 = lVar5 + 1;
      pnVar2 = cline->options + lVar5;
    } while (cline->options[lVar5].longname != (char *)0x0);
  }
  return;
}

Assistant:

void nn_free_options (struct nn_commandline *cline, void *target) {
    int i, j;
    struct nn_option *opt;
    struct nn_blob *blob;
    struct nn_string_list *lst;

    for (i = 0;; ++i) {
        opt = &cline->options[i];
        if (!opt->longname)
            break;
        switch(opt->type) {
        case NN_OPT_LIST_APPEND:
        case NN_OPT_LIST_APPEND_FMT:
            lst = (struct nn_string_list *)(((char *)target) + opt->offset);
            nn_assert (lst);
            if(lst->items) {
                free(lst->items);
                lst->items = NULL;
            }
            if(lst->to_free) {
                for(j = 0; j < lst->to_free_num; ++j) {
                    free(lst->to_free[j]);
                }
                free(lst->to_free);
                lst->to_free = NULL;
            }
            break;
        case NN_OPT_READ_FILE:
        case NN_OPT_BLOB:
            blob = (struct nn_blob *)(((char *)target) + opt->offset);
            if(blob->need_free && blob->data) {
                free(blob->data);
                blob->need_free = 0;
            }
            break;
        default:
            break;
        }
    }
}